

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QRhiShaderResourceBindings *srb)

{
  QTextStream *this;
  _func_int **pp_Var1;
  long in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)srb);
  this = (QTextStream *)(srb->super_QRhiResource)._vptr_QRhiResource;
  this[0x30] = (QTextStream)0x0;
  QVar2.m_data = (storage_type *)0x1b;
  QVar2.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(this,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  local_48[0] = (QArrayData *)(srb->super_QRhiResource)._vptr_QRhiResource;
  if ((char)local_48[0][3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
    QTextStream::operator<<((QTextStream *)local_48[0],' ');
    local_48[0] = (QArrayData *)(srb->super_QRhiResource)._vptr_QRhiResource;
  }
  *(int *)&local_48[0][2].alloc = (int)local_48[0][2].alloc + 1;
  local_60.stream = (Stream *)0x0;
  QtPrivate::printSequentialContainer<QVarLengthArray<QRhiShaderResourceBinding,12ll>>
            ((QtPrivate *)&local_58,(Stream *)local_48,"QVarLengthArray",
             (QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)(in_RDX + 0x30));
  QDebug::~QDebug((QDebug *)local_48);
  QTextStream::operator<<(&(local_58.stream)->ts,')');
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  pp_Var1 = (srb->super_QRhiResource)._vptr_QRhiResource;
  (srb->super_QRhiResource)._vptr_QRhiResource = (_func_int **)0x0;
  *(_func_int ***)dbg.stream = pp_Var1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiShaderResourceBindings &srb)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiShaderResourceBindings("
                  << srb.m_bindings
                  << ')';
    return dbg;
}